

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

bool __thiscall cs::codecvt::gbk::is_identifier(gbk *this,char32_t ch)

{
  bool bVar1;
  int iVar2;
  uint in_ESI;
  undefined1 local_16;
  undefined1 local_15;
  undefined1 local_1;
  
  bVar1 = compiler_type::issignal(L'\0');
  if (bVar1) {
    local_1 = false;
  }
  else if ((in_ESI & 0x8000) == 0) {
    local_16 = true;
    if (in_ESI != 0x5f) {
      iVar2 = iswalnum(in_ESI);
      local_16 = iVar2 != 0;
    }
    local_1 = local_16;
  }
  else {
    if ((((in_ESI < 0xb0a1) || (local_15 = true, 0xf7fe < in_ESI)) &&
        ((in_ESI < 0x8140 || (local_15 = true, 0xa0fe < in_ESI)))) &&
       ((in_ESI < 0xaa40 || (local_15 = true, 0xfea0 < in_ESI)))) {
      local_15 = in_ESI == 0xa996;
    }
    local_1 = local_15;
  }
  return local_1;
}

Assistant:

bool is_identifier(char32_t ch) override
			{
				if (compiler_type::issignal(ch))
					return false;
				/**
				 * Chinese Character in GBK Charset
				 * GBK/2: 0xB0A1 - 0xF7FE
				 * GBK/3: 0x8140 - 0xA0FE
				 * GBK/4: 0xAA40 - 0xFEA0
				 * GBK/5: 0xA996
				 */
				if (ch & u32_blck_begin)
					return (ch >= 0xB0A1 && ch <= 0xF7FE) || (ch >= 0x8140 && ch <= 0xA0FE) ||
					       (ch >= 0xAA40 && ch <= 0xFEA0) || ch == 0xA996;
				else
					return ch == '_' || std::iswalnum(ch);
			}